

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  strbuf *out;
  int iVar3;
  char **ppcVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *__s1;
  BinarySource src [1];
  BinarySource local_58;
  
  __stream = _stdin;
  __stream_00 = _stdout;
  if (argc < 2) {
LAB_0010ae67:
    values = newtree234(valuecmp);
    atexit(free_all_values);
    pcVar2 = fgetline((FILE *)__stream);
    for (pcVar2 = chomp(pcVar2); pcVar2 != (char *)0x0; pcVar2 = chomp(pcVar2)) {
      local_58.len = strlen(pcVar2);
      local_58.pos = 0;
      local_58.err = BSE_NO_ERROR;
      local_58.data = pcVar2;
      local_58.binarysource_ = &local_58;
      out = strbuf_new();
      process_line(&local_58,out);
      if (nfinalisers != 0) {
        lVar7 = 8;
        uVar5 = 0;
        do {
          (**(code **)((long)finalisers + lVar7 + -8))(out);
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar5 < nfinalisers);
      }
      nfinalisers = 0;
      if (out->len == 0) {
        lVar7 = 0;
      }
      else {
        sVar6 = 0;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + (ulong)(out->s[sVar6] == '\n');
          sVar6 = sVar6 + 1;
        } while (out->len != sVar6);
      }
      fprintf(__stream_00,"%zu\n%s",lVar7);
      fflush(__stream_00);
      strbuf_free(out);
      safefree(pcVar2);
      pcVar2 = fgetline((FILE *)__stream);
    }
    if (__stream != _stdin) {
      fclose(__stream);
      __stream = _stdin;
    }
    iVar3 = 0;
    if (__stream_00 != __stream) {
      fclose(__stream_00);
      iVar3 = 0;
    }
  }
  else {
    bVar1 = 1;
    pcVar2 = (char *)0x0;
    pcVar8 = (char *)0x0;
    do {
      iVar3 = argc + -1;
      __s1 = argv[1];
      ppcVar4 = argv + 1;
      if ((bool)(*__s1 == '-' & bVar1)) {
        if ((__s1[1] == 'o') && (__s1[2] == '\0')) {
          if (argc == 2) {
            main_cold_4();
            goto LAB_0010affa;
          }
          iVar3 = argc + -2;
          pcVar2 = argv[2];
          ppcVar4 = argv + 2;
          bVar1 = 1;
          __s1 = pcVar8;
        }
        else {
          if ((__s1[1] != '-') || (__s1[2] != '\0')) {
            iVar3 = strcmp(__s1,"--help");
            if (iVar3 == 0) {
              puts("usage: testcrypt [INFILE] [-o OUTFILE]");
              puts(" also: testcrypt --help       display this text");
              return 0;
            }
            fprintf(_stderr,"unknown command line option \'%s\'\n",__s1);
            goto LAB_0010affa;
          }
          bVar1 = 0;
          __s1 = pcVar8;
        }
      }
      else if (pcVar8 != (char *)0x0) {
        main_cold_1();
        goto LAB_0010affa;
      }
      argv = ppcVar4;
      pcVar8 = __s1;
      argc = iVar3;
    } while (1 < iVar3);
    if ((__s1 == (char *)0x0) || (__stream = fopen(__s1,"r"), __stream != (FILE *)0x0)) {
      __stream_00 = _stdout;
      if ((pcVar2 == (char *)0x0) || (__stream_00 = fopen(pcVar2,"w"), __stream_00 != (FILE *)0x0))
      goto LAB_0010ae67;
      main_cold_3();
    }
    else {
      main_cold_2();
    }
LAB_0010affa:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    const char *infile = NULL, *outfile = NULL;
    bool doing_opts = true;

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-o")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-o' expects a filename\n");
                    return 1;
                }
                outfile = *++argv;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("usage: testcrypt [INFILE] [-o OUTFILE]\n");
                printf(" also: testcrypt --help       display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!infile) {
            infile = p;
        } else {
            fprintf(stderr, "can only handle one input file name\n");
            return 1;
        }
    }

    FILE *infp = stdin;
    if (infile) {
        infp = fopen(infile, "r");
        if (!infp) {
            fprintf(stderr, "%s: open: %s\n", infile, strerror(errno));
            return 1;
        }
    }

    FILE *outfp = stdout;
    if (outfile) {
        outfp = fopen(outfile, "w");
        if (!outfp) {
            fprintf(stderr, "%s: open: %s\n", outfile, strerror(errno));
            return 1;
        }
    }

    values = newtree234(valuecmp);

    atexit(free_all_values);

    for (char *line; (line = chomp(fgetline(infp))) != NULL ;) {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, line, strlen(line));
        strbuf *sb = strbuf_new();
        process_line(src, sb);
        run_finalisers(sb);
        size_t lines = 0;
        for (size_t i = 0; i < sb->len; i++)
            if (sb->s[i] == '\n')
                lines++;
        fprintf(outfp, "%"SIZEu"\n%s", lines, sb->s);
        fflush(outfp);
        strbuf_free(sb);
        sfree(line);
    }

    if (infp != stdin)
        fclose(infp);
    if (outfp != stdin)
        fclose(outfp);

    return 0;
}